

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O2

void __thiscall QtMWidgets::BusyIndicator::paintEvent(BusyIndicator *this,QPaintEvent *param_1)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  QPainter p;
  QPainterPath path;
  QVariant local_88;
  QConicalGradient gradient;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  lVar2 = *(long *)&this->field_0x20;
  QPainter::translate(&p,(double)(((*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1) / 2),
                      (double)(((*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1) / 2));
  QPainterPath::QPainterPath(&path);
  QPainterPath::setFillRule((FillRule)&path);
  iVar1 = ((this->d).d)->outerRadius;
  dVar3 = (double)-iVar1;
  dVar4 = (double)(iVar1 * 2);
  QPainterPath::addEllipse(&path,dVar3,dVar3,dVar4,dVar4);
  iVar1 = ((this->d).d)->innerRadius;
  dVar3 = (double)-iVar1;
  dVar4 = (double)(iVar1 * 2);
  QPainterPath::addEllipse(&path,dVar3,dVar3,dVar4,dVar4);
  QPainter::setPen((RenderHint)&p);
  QVariantAnimation::currentValue();
  dVar3 = (double)QVariant::toReal((bool *)&local_88);
  QConicalGradient::QConicalGradient(&gradient,0.0,0.0,-dVar3);
  QVariant::~QVariant(&local_88);
  QColor::QColor((QColor *)&local_88,transparent);
  QGradient::setColorAt(0.0,(QColor *)&gradient);
  QGradient::setColorAt(0.05,(QColor *)&gradient);
  QColor::QColor((QColor *)&local_88,transparent);
  QGradient::setColorAt(1.0,(QColor *)&gradient);
  QBrush::QBrush((QBrush *)&local_88,(QGradient *)&gradient);
  QPainter::setBrush((QBrush *)&p);
  QBrush::~QBrush((QBrush *)&local_88);
  QPainter::drawPath((QPainterPath *)&p);
  QConicalGradient::~QConicalGradient(&gradient);
  QPainterPath::~QPainterPath(&path);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
BusyIndicator::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( width() / 2, height() / 2 );

	QPainterPath path;
	path.setFillRule( Qt::OddEvenFill );
	path.addEllipse( - d->outerRadius, - d->outerRadius,
		d->outerRadius * 2, d->outerRadius * 2 );
	path.addEllipse( - d->innerRadius, - d->innerRadius,
		d->innerRadius * 2, d->innerRadius * 2 );

	p.setPen( Qt::NoPen );

	QConicalGradient gradient( 0, 0, - d->animation->currentValue().toReal() );
	gradient.setColorAt( 0.0, Qt::transparent );
	gradient.setColorAt( 0.05, d->color );
	gradient.setColorAt( 1.0, Qt::transparent );

	p.setBrush( gradient );

	p.drawPath( path );
}